

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_resetCCtx_usingCDict
                 (ZSTD_CCtx *cctx,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,U64 pledgedSrcSize,
                 ZSTD_buffered_policy_e zbuff)

{
  int iVar1;
  long lVar2;
  undefined8 *puVar3;
  byte bVar4;
  ZSTD_CCtx_params in_stack_fffffffffffffee8;
  ZSTD_buffered_policy_e zbuff_local;
  U64 pledgedSrcSize_local;
  ZSTD_CCtx_params *params_local;
  ZSTD_CDict *cdict_local;
  ZSTD_CCtx *cctx_local;
  
  bVar4 = 0;
  iVar1 = ZSTD_shouldAttachDict(cdict,params,pledgedSrcSize);
  if (iVar1 == 0) {
    puVar3 = (undefined8 *)&stack0xfffffffffffffee8;
    for (lVar2 = 0x16; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar3 = *(undefined8 *)params;
      params = (ZSTD_CCtx_params *)((long)params + (ulong)bVar4 * -0x10 + 8);
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
    }
    cctx_local = (ZSTD_CCtx *)
                 ZSTD_resetCCtx_byCopyingCDict
                           (cctx,cdict,in_stack_fffffffffffffee8,pledgedSrcSize,zbuff);
  }
  else {
    puVar3 = (undefined8 *)&stack0xfffffffffffffee8;
    for (lVar2 = 0x16; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar3 = *(undefined8 *)params;
      params = (ZSTD_CCtx_params *)((long)params + (ulong)bVar4 * -0x10 + 8);
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
    }
    cctx_local = (ZSTD_CCtx *)
                 ZSTD_resetCCtx_byAttachingCDict
                           (cctx,cdict,in_stack_fffffffffffffee8,pledgedSrcSize,zbuff);
  }
  return (size_t)cctx_local;
}

Assistant:

static size_t ZSTD_resetCCtx_usingCDict(ZSTD_CCtx* cctx,
                            const ZSTD_CDict* cdict,
                            const ZSTD_CCtx_params* params,
                            U64 pledgedSrcSize,
                            ZSTD_buffered_policy_e zbuff)
{

    DEBUGLOG(4, "ZSTD_resetCCtx_usingCDict (pledgedSrcSize=%u)",
                (unsigned)pledgedSrcSize);

    if (ZSTD_shouldAttachDict(cdict, params, pledgedSrcSize)) {
        return ZSTD_resetCCtx_byAttachingCDict(
            cctx, cdict, *params, pledgedSrcSize, zbuff);
    } else {
        return ZSTD_resetCCtx_byCopyingCDict(
            cctx, cdict, *params, pledgedSrcSize, zbuff);
    }
}